

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O2

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,boost::optional<int>,void>::operator()
          (parse_flag_short<std::__cxx11::string,boost::optional<int>,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              last,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *param_3,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_4,shared_ptr<boost::optional<int>_> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  char __rhs;
  char *s_00;
  shared_ptr<int> sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  undefined1 local_100 [16];
  undefined1 local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (it->_M_current + 1 == last._M_current) {
    std::make_shared<boost::optional<int>>();
    std::__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
  }
  else {
    __rhs = *it->_M_current;
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>((string *)local_f0)
    ;
    it->_M_current = last._M_current + -1;
    sVar1 = std::
            function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<std::shared_ptr<int>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &flg->read);
    if ((uint *)local_100._0_8_ == (uint *)0x0) {
      widen<std::__cxx11::string>
                (&local_70,(detail *)"invalid argument: -",
                 (char *)sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                         ._M_pi);
      std::operator+(&local_50,&local_70,__rhs);
      widen<std::__cxx11::string>(&local_90,(detail *)0x15a583,s_00);
      std::operator+(&local_d0,&local_50,&local_90);
      std::operator+(&local_b0,&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      std::__cxx11::string::operator=((string *)err,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)(((ulong)*(uint *)local_100._0_8_ << 0x20) + 1);
      std::make_shared<boost::optional<int>,boost::optional<int>const&>((optional<int> *)&local_b0);
      std::__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2> *)&local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    std::__cxx11::string::~string((string *)local_f0);
  }
  return;
}

Assistant:

void operator()(
        NameIterator &it, NameIterator last, Iterator &, Iterator,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        auto const name = *it;
        if (std::next(it) == last) {
            value = std::make_shared<Value>();
        } else {
            auto const s = String(std::next(it), last);
            it = std::prev(last);
            auto const v = flg.read(s);
            if (!v) {
                err = widen<String>("invalid argument: -") + name + widen<String>(" ") + s;
                return;
            }
            value = copy_shared(optional_traits<Value>::construct(*v));
        }
    }